

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

Test * GraphTestRuleVariablesInScope::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestRuleVariablesInScope((GraphTestRuleVariablesInScope *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, RuleVariablesInScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = depfile is $depfile\n"
"build out: r in\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("depfile is x", edge->EvaluateCommand());
}